

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O2

void __thiscall
glslang::HlslParseContext::wrapupSwitchSubsequence
          (HlslParseContext *this,TIntermAggregate *statements,TIntermNode *branchNode)

{
  _List_node_base *this_00;
  long *plVar1;
  long *plVar2;
  int iVar3;
  long lVar4;
  undefined4 extraout_var;
  undefined8 uVar5;
  undefined4 extraout_var_01;
  char *pcVar6;
  char *pcVar7;
  uint uVar8;
  _func_int **pp_Var9;
  TIntermNode *branchNode_local;
  TIntermAggregate *local_38;
  undefined4 extraout_var_00;
  
  this_00 = (this->super_TParseContextBase).switchSequenceStack.
            super_list<glslang::TVector<TIntermNode_*>_*,_glslang::pool_allocator<glslang::TVector<TIntermNode_*>_*>_>
            .
            super__List_base<glslang::TVector<TIntermNode_*>_*,_glslang::pool_allocator<glslang::TVector<TIntermNode_*>_*>_>
            ._M_impl._M_node.super__List_node_base._M_prev[1]._M_next;
  branchNode_local = branchNode;
  if (statements != (TIntermAggregate *)0x0) {
    (*(statements->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode
      [0x31])(statements,1);
    local_38 = statements;
    std::vector<TIntermNode*,glslang::pool_allocator<TIntermNode*>>::emplace_back<TIntermNode*>
              ((vector<TIntermNode*,glslang::pool_allocator<TIntermNode*>> *)this_00,
               (TIntermNode **)&local_38);
  }
  if (branchNode != (TIntermNode *)0x0) {
    uVar8 = 0;
    while( true ) {
      if ((ulong)((long)this_00[1]._M_next - (long)this_00->_M_prev >> 3) <= (ulong)uVar8) break;
      lVar4 = (*(code *)(&this_00->_M_prev->_M_next)[uVar8]->_M_next[6]._M_prev)();
      if (lVar4 != 0) {
        plVar1 = *(long **)(lVar4 + 0x28);
        iVar3 = (*branchNode->_vptr_TIntermNode[0xd])(branchNode);
        plVar2 = *(long **)(CONCAT44(extraout_var,iVar3) + 0x28);
        if (plVar1 == (long *)0x0 && plVar2 == (long *)0x0) {
          iVar3 = (**branchNode->_vptr_TIntermNode)(branchNode);
          uVar5 = CONCAT44(extraout_var_00,iVar3);
          pp_Var9 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
          pcVar7 = "duplicate label";
          pcVar6 = "default";
LAB_0039d183:
          (*pp_Var9[0x2d])(this,uVar5,pcVar7,pcVar6,"");
        }
        else if ((plVar1 != (long *)0x0) && (plVar2 != (long *)0x0)) {
          lVar4 = (**(code **)(*plVar1 + 0x28))(plVar1);
          if (lVar4 != 0) {
            lVar4 = (**(code **)(*plVar2 + 0x28))(plVar2);
            if (lVar4 != 0) {
              lVar4 = (**(code **)(*plVar1 + 0x28))(plVar1);
              iVar3 = **(int **)(*(long *)(lVar4 + 0xc0) + 8);
              lVar4 = (**(code **)(*plVar2 + 0x28))(plVar2);
              if (iVar3 == **(int **)(*(long *)(lVar4 + 0xc0) + 8)) {
                iVar3 = (**branchNode->_vptr_TIntermNode)(branchNode);
                uVar5 = CONCAT44(extraout_var_01,iVar3);
                pp_Var9 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
                pcVar7 = "duplicated value";
                pcVar6 = "case";
                goto LAB_0039d183;
              }
            }
          }
        }
      }
      uVar8 = uVar8 + 1;
    }
    std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::push_back
              ((vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *)this_00,
               &branchNode_local);
  }
  return;
}

Assistant:

void HlslParseContext::wrapupSwitchSubsequence(TIntermAggregate* statements, TIntermNode* branchNode)
{
    TIntermSequence* switchSequence = switchSequenceStack.back();

    if (statements) {
        statements->setOperator(EOpSequence);
        switchSequence->push_back(statements);
    }
    if (branchNode) {
        // check all previous cases for the same label (or both are 'default')
        for (unsigned int s = 0; s < switchSequence->size(); ++s) {
            TIntermBranch* prevBranch = (*switchSequence)[s]->getAsBranchNode();
            if (prevBranch) {
                TIntermTyped* prevExpression = prevBranch->getExpression();
                TIntermTyped* newExpression = branchNode->getAsBranchNode()->getExpression();
                if (prevExpression == nullptr && newExpression == nullptr)
                    error(branchNode->getLoc(), "duplicate label", "default", "");
                else if (prevExpression != nullptr &&
                    newExpression != nullptr &&
                    prevExpression->getAsConstantUnion() &&
                    newExpression->getAsConstantUnion() &&
                    prevExpression->getAsConstantUnion()->getConstArray()[0].getIConst() ==
                    newExpression->getAsConstantUnion()->getConstArray()[0].getIConst())
                    error(branchNode->getLoc(), "duplicated value", "case", "");
            }
        }
        switchSequence->push_back(branchNode);
    }
}